

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample03.cpp
# Opt level: O2

string * __thiscall Person::GetName_abi_cxx11_(string *__return_storage_ptr__,Person *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const { return m_name; }